

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void rawEnumerate(FILE *outf,char *groupname,dotNode *(*results) [7],int method,int nsel,int spike,
                 int outdots,int numSkinDots,float density,char *namestring,char *rawname,
                 double scoreBias)

{
  float fVar1;
  dotNode *pdVar2;
  long lVar3;
  dotNode_t *pdVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  
  if (numSkinDots < 1 || nsel < 1) {
    if (method == 0) {
      scoreBias = 0.0;
    }
    else if (spike == 0) goto LAB_0012d095;
  }
  else {
    local_80 = 0.0;
    lVar3 = 0;
    local_88 = 0.0;
    local_84 = 0.0;
    local_94 = 0.0;
    do {
      uVar5 = 0;
      do {
        pdVar2 = results[lVar3][uVar5];
        if (pdVar2 == (dotNode *)0x0) {
          fVar9 = 0.0;
          local_90 = 0.0;
          local_8c = 0.0;
          fVar8 = 0.0;
        }
        else {
          fVar8 = 0.0;
          local_8c = 0.0;
          local_90 = 0.0;
          fVar9 = 0.0;
          pdVar4 = pdVar2;
          do {
            if (spike == 0) {
              fVar9 = fVar9 + 1.0;
            }
            else {
              if (uVar5 < 3) {
                fVar9 = fVar9 + 1.0;
                dVar7 = (double)(pdVar4->gap / GAPweight);
                dVar7 = exp(-dVar7 * dVar7);
              }
              else {
                fVar1 = pdVar4->gap;
                fVar6 = -fVar1;
                if (-fVar1 <= fVar1) {
                  fVar6 = fVar1;
                }
                if ((int)uVar5 - 3U < 3) {
                  local_8c = local_8c + 1.0;
                  fVar8 = fVar8 - (float)((double)fVar6 * 0.5 * (double)BUMPweight);
                  goto LAB_0012cf7b;
                }
                local_90 = local_90 + 1.0;
                dVar7 = (double)fVar6 * 0.5 * (double)HBweight;
              }
              fVar8 = fVar8 + (float)dVar7;
            }
LAB_0012cf7b:
            pdVar4 = pdVar4->next;
          } while (pdVar4 != (dotNode_t *)0x0);
        }
        if (pdVar2 != (dotNode *)0x0) {
          local_94 = local_94 + fVar9;
          local_84 = local_84 + local_90;
          local_88 = local_88 + local_8c;
          local_80 = local_80 + fVar8;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 7);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x72);
    if (method == 0) {
      scoreBias = (double)((local_84 + local_94 + local_88) / density);
    }
    else {
      if (spike != 0) {
        local_94 = local_80 / density;
      }
      scoreBias = (double)local_94 + scoreBias;
    }
  }
  fprintf((FILE *)outf,"%9.3f",scoreBias);
LAB_0012d095:
  if (*rawname != '\0') {
    fprintf((FILE *)outf," %s",rawname);
  }
  if ((*namestring != '\0') || (*groupname != '\0')) {
    fputs("#",(FILE *)outf);
    if (*namestring != '\0') {
      fprintf((FILE *)outf," %s",namestring);
    }
    if (*groupname != '\0') {
      fprintf((FILE *)outf," %s",groupname);
    }
  }
  fputc(10,(FILE *)outf);
  return;
}

Assistant:

void rawEnumerate(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
               int method, int nsel, int spike, int outdots, int numSkinDots,
	       float density, char *namestring, char *rawname, double scoreBias)
{/*rawEnumerate*/
   int i, j, doit;
   float gs, hs, bs, hslen, bslen, tgs, ths, tbs, thslen, tbslen;
   float dtgp, score, tGscore, tHscore, tBscore, tscore, scoreValue;
   double scaledGap, slen;
   dotNode *node;

   /*autobondrot: countDots==1, rawOutput==1  */
   /*  *rawname holds autobondrot angle values as space_char deliniated string*/

   if (nsel <= 0 || numSkinDots <= 0) { /* empty selection */
      if (method == EXTERNALSURFACE) {
	 fprintf(outf, "%9.3f", 0.0);
      }
      else if (spike) {
	 fprintf(outf, "%9.3f", scoreBias);
      }

      if (*rawname) { fprintf(outf, " %s", rawname); }
      if (*namestring || *groupname) {
	 fprintf(outf, "%s", RAW_HEADER_COMMENT);
	 if (*namestring) { fprintf(outf, " %s", namestring); }
	 if (*groupname)  { fprintf(outf, " %s", groupname);  }
      }
      fprintf(outf, "\n");
      return;
   }

   tgs = ths = thslen = tbs = tbslen = 0.0;
   tGscore = tHscore = tBscore = tscore = 0.0;
   for (i = 0; i < NUMATOMTYPES; i++) {
   for (j = 0; j < NODEWIDTH; j++)
   {
      gs = hs = hslen = bs = bslen = score = 0.0;
      node = results[i][j];
      doit = (node != NULL);
      while(node)
      {
         if (spike)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
         {
            // if (j == 0 || j == 1) { /* contact dot */
             if(j ==0 || j ==1 || j ==2){ /* contacts, and weak H bonds*/
                 gs += 1.0;
                 dtgp = node->gap;
                 scaledGap = dtgp/GAPweight;
                 scoreValue = exp(-scaledGap*scaledGap);
                 score   += scoreValue;
                 tGscore += scoreValue;
             }
            // else if (j == 2 || j == 3) { /* bump */
             else if(j ==3 || j ==4 || j ==5){ /* bump */
                 bs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 bslen += slen;
                 scoreValue = - BUMPweight * slen;
                 score   += scoreValue;
                 tBscore += scoreValue;
             }
             else { /* H-bond */
                 hs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 hslen += slen;
                 scoreValue = HBweight * slen;
                 score   += scoreValue;
                 tHscore += scoreValue;
             }
         }
         else {
             gs += 1.0;
         }
         node = node->next;
      }
      if (doit) {
         tgs += gs;
         ths += hs;
         thslen += hslen;
         tbs += bs;
         tbslen += bslen;
         tscore += score;
      }
   }
   }

   /*output one line of information */
   if (method == EXTERNALSURFACE) {
      fprintf(outf, "%9.3f", (tgs+tbs+ths)/density);
   }
   else if (spike) /*autobondrot: spike==1 at least in all examples dcr tested*/
   {
      fprintf(outf, "%9.3f", scoreBias + (tscore/density));  /*value # ...*/
   }
   else {
      fprintf(outf, "%9.3f", scoreBias + tgs);
   }
   if (*rawname) { fprintf(outf, " %s", rawname); } /*autobondrot angle values*/
   if (*namestring || *groupname) {
      fprintf(outf, "%s", RAW_HEADER_COMMENT);
      if (*namestring) { fprintf(outf, " %s", namestring); }
      if (*groupname)  { fprintf(outf, " %s", groupname);  }
   }
   fprintf(outf, "\n"); /* NOTE this is the LF for above print statements*/

   /* char* rawname == buf that is filled in autobondrot.c/runnameAndTorsion()*/
   /* contains the autobondrot angle values in the order in which processed*/

}